

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void ft_glyphslot_preset_bitmap(FT_GlyphSlot slot,FT_Render_Mode mode,FT_Vector *origin)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uchar uVar4;
  uint uVar5;
  FT_Pos FVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  FT_Pos FVar10;
  long lVar11;
  ulong uVar12;
  FT_BBox local_48;
  
  if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 1) != 0)) {
    return;
  }
  if (origin == (FT_Vector *)0x0) {
    FVar10 = 0;
    FVar6 = 0;
  }
  else {
    FVar6 = origin->x;
    FVar10 = origin->y;
  }
  FT_Outline_Get_CBox(&slot->outline,&local_48);
  uVar9 = local_48.xMin + FVar6;
  uVar1 = local_48.yMin + FVar10;
  lVar7 = FVar6 + local_48.xMax;
  lVar11 = FVar10 + local_48.yMax;
  if (mode == FT_RENDER_MODE_LCD_V) {
    local_48.xMin = uVar9;
    local_48.yMin = uVar1;
    local_48.xMax = lVar7;
    local_48.yMax = lVar11;
    ft_lcd_padding(&local_48.yMin,&local_48.yMax,slot);
    uVar4 = '\x06';
LAB_00132f07:
    uVar12 = local_48.yMax + 0x3f;
    uVar9 = (local_48.xMax - (local_48.xMin & 0xffffffffffffffc0U)) + 0x3f >> 6;
    uVar5 = (uint)uVar9;
    uVar2 = (uint)(uVar12 - (local_48.yMin & 0xffffffffffffffc0U) >> 6);
    uVar3 = uVar5;
    if (uVar4 == '\x06') {
      uVar4 = '\x06';
      uVar2 = uVar2 * 3;
      goto LAB_00132f67;
    }
    if (uVar4 != '\x05') goto LAB_00132f67;
    uVar9 = uVar9 * 3;
    uVar3 = uVar5 * 3 + 3 & 0xfffffffc;
    uVar4 = '\x05';
  }
  else {
    if (mode == FT_RENDER_MODE_LCD) {
      uVar4 = '\x05';
      local_48.xMin = uVar9;
      local_48.yMin = uVar1;
      local_48.xMax = lVar7;
      local_48.yMax = lVar11;
      ft_lcd_padding(&local_48.xMin,&local_48.xMax,slot);
      goto LAB_00132f07;
    }
    if (mode != FT_RENDER_MODE_MONO) {
      uVar4 = '\x02';
      local_48.xMin = uVar9;
      local_48.yMin = uVar1;
      local_48.xMax = lVar7;
      local_48.yMax = lVar11;
      goto LAB_00132f07;
    }
    local_48.xMax = local_48.xMax - local_48.xMin;
    lVar8 = lVar7 + 0x3f;
    local_48.xMin = uVar9;
    if (0x3f < local_48.xMax) {
      lVar8 = lVar7 + 0x20;
      local_48.xMin = uVar9 + 0x20;
    }
    uVar12 = lVar11 + 0x3f;
    if (0x3f < local_48.yMax - local_48.yMin) {
      uVar12 = lVar11 + 0x20;
      uVar1 = uVar1 + 0x20;
    }
    uVar9 = lVar8 - (local_48.xMin & 0xffffffffffffffc0U) >> 6;
    uVar2 = (uint)(uVar12 - (uVar1 & 0xffffffffffffffc0) >> 6);
    uVar3 = (uint)(uVar9 + 0xf >> 3) & 0xfffffffe;
    uVar4 = '\x01';
  }
  uVar5 = (uint)uVar9;
LAB_00132f67:
  slot->bitmap_left = (FT_Int)((ulong)local_48.xMin >> 6);
  slot->bitmap_top = (FT_Int)(uVar12 >> 6);
  (slot->bitmap).pixel_mode = uVar4;
  (slot->bitmap).num_grays = 0x100;
  (slot->bitmap).width = uVar5;
  (slot->bitmap).rows = uVar2;
  (slot->bitmap).pitch = uVar3;
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_preset_bitmap( FT_GlyphSlot      slot,
                              FT_Render_Mode    mode,
                              const FT_Vector*  origin )
  {
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;

    FT_Pixel_Mode  pixel_mode;

    FT_BBox  cbox;
    FT_Pos   x_shift = 0;
    FT_Pos   y_shift = 0;
    FT_Pos   x_left, y_top;
    FT_Pos   width, height, pitch;


    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
      return;

    if ( origin )
    {
      x_shift = origin->x;
      y_shift = origin->y;
    }

    /* compute the control box, and grid-fit it, */
    /* taking into account the origin shift      */
    FT_Outline_Get_CBox( outline, &cbox );

    cbox.xMin += x_shift;
    cbox.yMin += y_shift;
    cbox.xMax += x_shift;
    cbox.yMax += y_shift;

    switch ( mode )
    {
    case FT_RENDER_MODE_MONO:
      pixel_mode = FT_PIXEL_MODE_MONO;
#if 1
      /* undocumented but confirmed: bbox values get rounded    */
      /* unless the rounded box can collapse for a narrow glyph */
      if ( cbox.xMax - cbox.xMin < 64 )
      {
        cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
        cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      }
      else
      {
        cbox.xMin = FT_PIX_ROUND_LONG( cbox.xMin );
        cbox.xMax = FT_PIX_ROUND_LONG( cbox.xMax );
      }

      if ( cbox.yMax - cbox.yMin < 64 )
      {
        cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
        cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
      }
      else
      {
        cbox.yMin = FT_PIX_ROUND_LONG( cbox.yMin );
        cbox.yMax = FT_PIX_ROUND_LONG( cbox.yMax );
      }
#else
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
#endif
      break;

    case FT_RENDER_MODE_LCD:
      pixel_mode = FT_PIXEL_MODE_LCD;
      ft_lcd_padding( &cbox.xMin, &cbox.xMax, slot );
      goto Round;

    case FT_RENDER_MODE_LCD_V:
      pixel_mode = FT_PIXEL_MODE_LCD_V;
      ft_lcd_padding( &cbox.yMin, &cbox.yMax, slot );
      goto Round;

    case FT_RENDER_MODE_NORMAL:
    case FT_RENDER_MODE_LIGHT:
    default:
      pixel_mode = FT_PIXEL_MODE_GRAY;
    Round:
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
    }

    x_shift = SUB_LONG( x_shift, cbox.xMin );
    y_shift = SUB_LONG( y_shift, cbox.yMin );

    x_left = cbox.xMin >> 6;
    y_top  = cbox.yMax >> 6;

    width  = ( (FT_ULong)cbox.xMax - (FT_ULong)cbox.xMin ) >> 6;
    height = ( (FT_ULong)cbox.yMax - (FT_ULong)cbox.yMin ) >> 6;

    switch ( pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      pitch = ( ( width + 15 ) >> 4 ) << 1;
      break;

    case FT_PIXEL_MODE_LCD:
      width *= 3;
      pitch  = FT_PAD_CEIL( width, 4 );
      break;

    case FT_PIXEL_MODE_LCD_V:
      height *= 3;
      /* fall through */

    case FT_PIXEL_MODE_GRAY:
    default:
      pitch = width;
    }

    slot->bitmap_left = (FT_Int)x_left;
    slot->bitmap_top  = (FT_Int)y_top;

    bitmap->pixel_mode = (unsigned char)pixel_mode;
    bitmap->num_grays  = 256;
    bitmap->width      = (unsigned int)width;
    bitmap->rows       = (unsigned int)height;
    bitmap->pitch      = pitch;
  }